

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O1

void TPZShapeHDivConstant<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  TPZManVector<int,_15> locconorders;
  int local_a4;
  TPZManVector<int,_20> local_a0;
  
  piVar1 = local_a0.fExtAlloc;
  local_a0.super_TPZVec<int>.fStore = (int *)0x0;
  local_a0.super_TPZVec<int>.fNElements = 0;
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840040;
  uVar2 = sideorient->fNElements;
  if ((long)uVar2 < 0x15) {
    local_a0.super_TPZVec<int>.fStore = piVar1;
    local_a0.super_TPZVec<int>.fNAlloc = 0;
  }
  else {
    local_a0.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    local_a0.super_TPZVec<int>.fNAlloc = uVar2;
  }
  if (0 < (long)uVar2) {
    piVar3 = sideorient->fStore;
    uVar5 = 0;
    do {
      local_a0.super_TPZVec<int>.fStore[uVar5] = piVar3[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  local_a0.super_TPZVec<int>.fNElements = uVar2;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_a0);
  if (local_a0.super_TPZVec<int>.fStore == piVar1) {
    local_a0.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_a0.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_a0.super_TPZVec<int>.fStore);
  }
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,7);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,7);
  local_a4 = 1;
  TPZManVector<int,_15>::TPZManVector((TPZManVector<int,_15> *)&local_a0,0x13,&local_a4);
  piVar3 = connectorders->fStore;
  lVar4 = 0;
  do {
    local_a0.super_TPZVec<int>.fStore[lVar4 + 0xc] = piVar3[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::Initialize(ids,&local_a0.super_TPZVec<int>,data);
  if (local_a0.super_TPZVec<int>.fStore == piVar1) {
    local_a0.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_a0.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_a0.super_TPZVec<int>.fStore);
  }
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}